

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_function-c.cpp
# Opt level: O3

idx_t duckdb_init_get_column_index(duckdb_init_info info,idx_t column_index)

{
  vector<unsigned_long,_true> *this;
  const_reference pvVar1;
  
  if (info != (duckdb_init_info)0x0) {
    this = *(vector<unsigned_long,_true> **)(info + 0x10);
    if (column_index <
        (ulong)((long)(this->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)(this->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start >> 3)) {
      pvVar1 = duckdb::vector<unsigned_long,_true>::operator[](this,column_index);
      return *pvVar1;
    }
  }
  return 0;
}

Assistant:

idx_t duckdb_init_get_column_index(duckdb_init_info info, idx_t column_index) {
	if (!info) {
		return 0;
	}
	auto &init_info = GetCInitInfo(info);
	if (column_index >= init_info.column_ids.size()) {
		return 0;
	}
	return init_info.column_ids[column_index];
}